

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

_Bool Open_JTalk_load_dic(Open_JTalk *open_jtalk,char *dn_mecab)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  Mecab *in_RDI;
  char *in_stack_00000020;
  Mecab *in_stack_00000028;
  
  if (((in_RDI != (Mecab *)0x0) && (in_RSI != (char *)0x0)) && (sVar2 = strlen(in_RSI), sVar2 != 0))
  {
    JPCommon_refresh((JPCommon *)0x19da70);
    NJD_refresh((NJD *)0x19da7e);
    Mecab_refresh(in_RDI);
    iVar1 = Mecab_load(in_stack_00000028,in_stack_00000020);
    if (iVar1 != 1) {
      Open_JTalk_clear((Open_JTalk *)0x19daa5);
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

bool Open_JTalk_load_dic(Open_JTalk *open_jtalk, char *dn_mecab)
{
	if (open_jtalk == NULL || dn_mecab == NULL || strlen(dn_mecab) == 0)
	{
		return false;
	}

	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);

	if (Mecab_load(&open_jtalk->mecab, dn_mecab) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	return true;
}